

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O1

string * __thiscall
embree::BVHNStatistics<4>::Statistics::NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>>::
toString_abi_cxx11_(string *__return_storage_ptr__,void *this,BVH *bvh,double sahTotal,
                   size_t bytesTotal)

{
  undefined8 uVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  float fVar5;
  float fVar13;
  float fVar14;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ostringstream stream;
  long local_1a0;
  undefined8 local_198 [2];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0 + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"sah = ",6);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 7;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 3;
  fVar15 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[0] -
           (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[0];
  fVar16 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[1] -
           (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[1];
  fVar17 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[2] -
           (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[2];
  fVar5 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[0] -
          (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[0];
  fVar13 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[1] -
           (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[1];
  fVar14 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[2] -
           (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[2];
  fVar18 = fVar5 - fVar15;
  fVar19 = fVar13 - fVar16;
  fVar20 = fVar14 - fVar17;
  fVar13 = fVar13 - fVar16;
  fVar14 = fVar14 - fVar17;
  fVar5 = fVar5 - fVar15;
  std::ostream::_M_insert<double>
            (*this / (double)(fVar5 * fVar20 * 0.33333334 +
                              (fVar15 * fVar20 + fVar17 * fVar5) * 0.5 + fVar17 * fVar15 +
                             fVar14 * fVar19 * 0.33333334 +
                             (fVar17 * fVar19 + fVar16 * fVar14) * 0.5 + fVar16 * fVar17 +
                             fVar13 * fVar18 * 0.33333334 +
                             (fVar16 * fVar18 + fVar15 * fVar13) * 0.5 + fVar15 * fVar16));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," (",2);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 6;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
  fVar5 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[0] -
          (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[0];
  fVar13 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[1] -
           (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[1];
  fVar14 = (bvh->super_AccelData).bounds.bounds0.upper.field_0.m128[2] -
           (bvh->super_AccelData).bounds.bounds0.lower.field_0.m128[2];
  fVar15 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[0] -
           (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[0];
  fVar16 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[1] -
           (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[1];
  fVar17 = (bvh->super_AccelData).bounds.bounds1.upper.field_0.m128[2] -
           (bvh->super_AccelData).bounds.bounds1.lower.field_0.m128[2];
  fVar18 = fVar15 - fVar5;
  fVar19 = fVar16 - fVar13;
  fVar20 = fVar17 - fVar14;
  fVar16 = fVar16 - fVar13;
  fVar17 = fVar17 - fVar14;
  fVar15 = fVar15 - fVar5;
  poVar3 = std::ostream::_M_insert<double>
                     (((*this / (double)(fVar15 * fVar20 * 0.33333334 +
                                         (fVar5 * fVar20 + fVar14 * fVar15) * 0.5 + fVar14 * fVar5 +
                                        fVar17 * fVar19 * 0.33333334 +
                                        (fVar14 * fVar19 + fVar13 * fVar17) * 0.5 + fVar13 * fVar14
                                        + fVar16 * fVar18 * 0.33333334 +
                                          (fVar13 * fVar18 + fVar5 * fVar16) * 0.5 + fVar5 * fVar13)
                       ) * 100.0) / sahTotal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%), ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"#bytes = ",9);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 7;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
  lVar4 = *(long *)((long)this + 8) << 8;
  auVar6._8_4_ = (int)((ulong)*(long *)((long)this + 8) >> 0x18);
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     (((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," MB ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"(",1);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 6;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
  lVar4 = *(long *)((long)this + 8) << 8;
  auVar7._8_4_ = (int)((ulong)*(long *)((long)this + 8) >> 0x18);
  auVar7._0_8_ = lVar4;
  auVar7._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)(bytesTotal >> 0x20);
  auVar8._0_8_ = bytesTotal;
  auVar8._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     ((((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 100.0) /
                      ((auVar8._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)bytesTotal) - 4503599627370496.0)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%), ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"#nodes = ",9);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 7;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 6;
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 8) = 2;
  uVar1 = *(undefined8 *)((long)this + 0x10);
  auVar9._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar9._0_8_ = uVar1;
  auVar9._12_4_ = 0x45300000;
  lVar4 = *(long *)((long)this + 8) << 2;
  auVar10._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar10._0_8_ = lVar4;
  auVar10._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     ((((auVar9._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar10._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0))) * 100.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"% filled), ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"#bytes/prim = ",0xe);
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18) + 8) = 6;
  *(undefined8 *)((long)local_198 + *(long *)(local_1a0 + -0x18)) = 2;
  lVar4 = *(long *)((long)this + 8) << 8;
  auVar11._8_4_ = (int)((ulong)*(long *)((long)this + 8) >> 0x18);
  auVar11._0_8_ = lVar4;
  auVar11._12_4_ = 0x45300000;
  sVar2 = bvh->numPrimitives;
  auVar12._8_4_ = (int)(sVar2 >> 0x20);
  auVar12._0_8_ = sVar2;
  auVar12._12_4_ = 0x45300000;
  std::ostream::_M_insert<double>
            (((auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
             ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(BVH* bvh, double sahTotal, size_t bytesTotal) const
        {
          std::ostringstream stream;
          stream.setf(std::ios::fixed, std::ios::floatfield);
          stream << "sah = " << std::setw(7) << std::setprecision(3) << sah(bvh);
          stream << " (" << std::setw(6) << std::setprecision(2) << 100.0*sah(bvh)/sahTotal << "%), ";          
          stream << "#bytes = " << std::setw(7) << std::setprecision(2) << bytes()/1E6  << " MB ";
          stream << "(" << std::setw(6) << std::setprecision(2) << 100.0*double(bytes())/double(bytesTotal) << "%), ";
          stream << "#nodes = " << std::setw(7) << numNodes << " (" << std::setw(6) << std::setprecision(2) << 100.0*fillRate() << "% filled), ";
          stream << "#bytes/prim = " << std::setw(6) << std::setprecision(2) << double(bytes())/double(bvh->numPrimitives);
          return stream.str();
        }